

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int base64_decode_tail_using_maps(base64_maps_t *maps,char *dest,char *src,size_t srclen)

{
  int iVar1;
  int *piVar2;
  char longsrc [4];
  
  while( true ) {
    if (srclen == 0) {
      return 0;
    }
    if (src[srclen - 1] != '=') break;
    srclen = srclen - 1;
  }
  if (srclen == 1) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    memcpy(longsrc,src,srclen);
    memset(longsrc + srclen,0x41,4 - srclen);
    iVar1 = base64_decode_quartet_using_maps(maps,dest,longsrc);
    if (iVar1 != -1) {
      return (int)srclen + -1;
    }
  }
  return -1;
}

Assistant:

int base64_decode_tail_using_maps(const base64_maps_t *maps, char dest[3],
				  const char * src, const size_t srclen)
{
	char longsrc[4];
	int quartet_result;
	size_t insize = srclen;

	while (insize != 0 &&
	       src[insize-1] == '=') { /* throw away padding symbols */
		insize--;
	}
	if (insize == 0) {
		return 0;
	}
	if (insize == 1) {
		/* the input is malformed.... */
		errno = EINVAL;
		return -1;
	}
	memcpy(longsrc, src, insize);
	memset(longsrc+insize, 'A', 4-insize);
	quartet_result = base64_decode_quartet_using_maps(maps, dest, longsrc);
	if (quartet_result == -1) {
		return -1;
	}

	return insize - 1;
}